

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

void __thiscall QToolBoxPrivate::updateTabs(QToolBoxPrivate *this)

{
  pointer puVar1;
  Page *pPVar2;
  QToolBoxButton *this_00;
  QWidget *this_01;
  ColorRole CVar3;
  QPalette *pQVar4;
  long *plVar5;
  int iVar6;
  QToolBoxButton *pQVar7;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  pointer puVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QBrush local_50 [8];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->currentPage == (Page *)0x0) {
    pQVar7 = (QToolBoxButton *)0x0;
  }
  else {
    pQVar7 = this->currentPage->button;
  }
  puVar8 = (this->pageList).
           super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->pageList).
           super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar1) {
    bVar9 = false;
    iVar6 = 0;
    do {
      pPVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
               ._M_t.
               super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
               .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
      this_00 = pPVar2->button;
      this_00->indexInPage = iVar6;
      if (bVar9) {
        this_01 = pPVar2->widget;
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQVar4 = QWidget::palette((QWidget *)this_00);
        QPalette::QPalette((QPalette *)local_48,pQVar4);
        CVar3 = QWidget::backgroundRole((QWidget *)this_00);
        pQVar4 = QWidget::palette(this_01);
        QWidget::backgroundRole(this_01);
        plVar5 = (long *)QPalette::brush((ColorGroup)pQVar4,Dark);
        QBrush::QBrush(local_50,(QColor *)(*plVar5 + 8),SolidPattern);
        QPalette::setBrush((ColorGroup)(QPalette *)local_48,Mid,(QBrush *)(ulong)CVar3);
        QBrush::~QBrush(local_50);
        QWidget::setPalette((QWidget *)this_00,(QPalette *)local_48);
        QWidget::update((QWidget *)this_00);
        QPalette::~QPalette((QPalette *)local_48);
      }
      else {
        CVar3 = QWidget::backgroundRole((QWidget *)this_00);
        if (CVar3 != Window) {
          QWidget::setBackgroundRole((QWidget *)this_00,Window);
          QWidget::update((QWidget *)this_00);
        }
      }
      bVar9 = this_00 == pQVar7;
      iVar6 = iVar6 + 1;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBoxPrivate::updateTabs()
{
    QToolBoxButton *lastButton = currentPage ? currentPage->button : nullptr;
    bool after = false;
    int index = 0;
    for (const auto &page : pageList) {
        QToolBoxButton *tB = page->button;
        // update indexes, since the updates are delayed, the indexes will be correct
        // when we actually paint.
        tB->setIndex(index);
        QWidget *tW = page->widget;
        if (after) {
            QPalette p = tB->palette();
            p.setColor(tB->backgroundRole(), tW->palette().color(tW->backgroundRole()));
            tB->setPalette(p);
            tB->update();
        } else if (tB->backgroundRole() != QPalette::Window) {
            tB->setBackgroundRole(QPalette::Window);
            tB->update();
        }
        after = tB == lastButton;
        ++index;
    }
}